

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.cc
# Opt level: O0

void __thiscall
VW::config::options_serializer_boost_po::add_impl<VW::config::typelist<>>
          (options_serializer_boost_po *this,base_option *options)

{
  undefined8 uVar1;
  stringstream __msg;
  string *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  vw_exception *in_stack_fffffffffffffe60;
  stringstream local_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(&local_188,"That is an unsupported option type.");
  uVar1 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  vw_exception::vw_exception
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
             in_stack_fffffffffffffe48);
  __cxa_throw(uVar1,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void options_serializer_boost_po::add_impl<typelist<>>(base_option& options)
{
  THROW("That is an unsupported option type.");
}